

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::CollectOriginalDirectories(cmOrderDirectories *this)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
  *entry;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
  *__range1;
  cmOrderDirectories *this_local;
  
  AddOriginalDirectories(this,&this->UserDirectories);
  __end1 = std::
           vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
           ::begin(&this->ConstraintEntries);
  entry = (unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
           *)std::
             vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
             ::end(&this->ConstraintEntries);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_*,_std::vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>_>
                                *)&entry);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_*,_std::vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>_>
              ::operator*(&__end1);
    this_01 = std::
              unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
              ::operator->(this_00);
    cmOrderDirectoriesConstraint::AddDirectory(this_01);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_*,_std::vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>_>
    ::operator++(&__end1);
  }
  AddOriginalDirectories(this,&this->LanguageDirectories);
  return;
}

Assistant:

void cmOrderDirectories::CollectOriginalDirectories()
{
  // Add user directories specified for inclusion.  These should be
  // indexed first so their original order is preserved as much as
  // possible subject to the constraints.
  this->AddOriginalDirectories(this->UserDirectories);

  // Add directories containing constraints.
  for (const auto& entry : this->ConstraintEntries) {
    entry->AddDirectory();
  }

  // Add language runtime directories last.
  this->AddOriginalDirectories(this->LanguageDirectories);
}